

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O1

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Segment *ppAVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  undefined2 uVar5;
  short sVar6;
  AF_Direction AVar7;
  long lVar8;
  AF_Segment pAVar9;
  AF_StyleMetrics_conflict pAVar10;
  FT_Memory memory;
  AF_Edge *ppAVar11;
  int iVar12;
  uint uVar13;
  AF_AxisHints axis_00;
  ulong uVar14;
  FT_Long FVar15;
  long lVar16;
  AF_Segment pAVar17;
  AF_Point_conflict pAVar18;
  long lVar19;
  AF_Edge_conflict pAVar20;
  int iVar21;
  AF_Segment_conflict pAVar22;
  AF_Segment pAVar23;
  AF_Edge_conflict pAVar24;
  short sVar25;
  uint uVar26;
  AF_Segment_conflict seg;
  ulong uVar27;
  AF_Segment_conflict pAVar28;
  ushort uVar29;
  AF_Edge_conflict pAVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ushort uVar36;
  AF_Segment_conflict pAVar38;
  int iVar39;
  AF_Segment pAVar40;
  AF_Segment_conflict pAVar41;
  bool bVar42;
  AF_AxisHints axis;
  AF_Edge_conflict local_70;
  AF_Segment_conflict local_60;
  AF_Edge_conflict local_38;
  ulong uVar37;
  
  uVar27 = (ulong)dim;
  axis_00 = hints->axis + uVar27;
  pAVar41 = hints->axis[uVar27].segments;
  if (pAVar41 == (AF_Segment_conflict)0x0) {
    pAVar38 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar38 = pAVar41 + axis_00->num_segments;
  }
  iVar12 = af_latin_hints_compute_segments(hints,dim);
  if ((iVar12 == 0) && (iVar12 = 0, pAVar41 < pAVar38)) {
    do {
      pAVar18 = pAVar41->first;
      uVar29 = pAVar18->flags;
      pAVar41->flags = pAVar41->flags & 0xfe;
      if (pAVar18 != pAVar41->last) {
        uVar29 = uVar29 & 3;
        do {
          pAVar18 = pAVar18->next;
          uVar36 = pAVar18->flags & 3;
          if (uVar29 == 0 && uVar36 == 0) goto LAB_0026f000;
          uVar29 = uVar36;
        } while (pAVar18 != pAVar41->last);
        pAVar41->flags = pAVar41->flags | 1;
      }
LAB_0026f000:
      pAVar41 = pAVar41 + 1;
    } while (pAVar41 < pAVar38);
    iVar12 = 0;
  }
  if (iVar12 == 0) {
    pAVar41 = hints->axis[uVar27].segments;
    if (pAVar41 == (AF_Segment_conflict)0x0) {
      pAVar38 = (AF_Segment_conflict)0x0;
    }
    else {
      pAVar38 = pAVar41 + axis_00->num_segments;
    }
    AVar7 = hints->axis[uVar27].major_dir;
    uVar26 = *(uint *)&hints->metrics[1].style_class;
    uVar14 = (ulong)(dim != AF_DIMENSION_HORZ) * 0x10;
    FVar15 = FT_DivFix(0xc0,*(FT_Long *)((long)hints->axis[0].embedded.segments + (uVar14 - 0x68)));
    if (pAVar41 < pAVar38) {
      lVar19 = 0;
      pAVar22 = pAVar41;
      do {
        cVar3 = pAVar22->dir;
        lVar16 = lVar19;
        pAVar28 = pAVar41;
        if (AVar7 == cVar3) {
          do {
            if (((lVar16 != 0) && ((int)pAVar28->dir + (int)cVar3 == 0)) &&
               (lVar33 = (long)pAVar28->pos - (long)pAVar22->pos, -1 < lVar33)) {
              uVar5 = pAVar22->max_coord;
              sVar25 = pAVar28->min_coord;
              if (pAVar28->min_coord < pAVar22->min_coord) {
                sVar25 = pAVar22->min_coord;
              }
              sVar6 = pAVar28->max_coord;
              if ((short)uVar5 < sVar6) {
                sVar6 = uVar5;
              }
              lVar35 = (long)sVar6 - (long)sVar25;
              if ((long)(ulong)(uVar26 >> 8) <= lVar35) {
                lVar2 = lVar33 * 8;
                lVar8 = pAVar22->score;
                if ((SBORROW8(lVar2,lVar8 * 9) != lVar2 + lVar8 * -9 < 0) &&
                   ((lVar2 < lVar8 * 7 || (pAVar22->len < lVar35)))) {
                  pAVar22->score = lVar33;
                  pAVar22->len = lVar35;
                  pAVar22->link = pAVar28;
                }
                lVar8 = pAVar28->score;
                if ((SBORROW8(lVar2,lVar8 * 9) != lVar2 + lVar8 * -9 < 0) &&
                   ((lVar2 < lVar8 * 7 || (pAVar28->len < lVar35)))) {
                  pAVar28->score = lVar33;
                  pAVar28->len = lVar35;
                  pAVar28->link = pAVar22;
                }
              }
            }
            pAVar28 = pAVar28 + 1;
            lVar16 = lVar16 + -0x50;
          } while (pAVar28 < pAVar38);
        }
        pAVar22 = pAVar22 + 1;
        lVar19 = lVar19 + 0x50;
      } while (pAVar22 < pAVar38);
      pAVar23 = pAVar41;
      if (pAVar41 < pAVar38) {
        do {
          pAVar17 = pAVar23->link;
          if ((pAVar17 != (AF_Segment)0x0) && (pAVar17->link == pAVar23)) {
            sVar25 = pAVar17->pos;
            sVar6 = pAVar23->pos;
            if ((sVar6 < sVar25) && (lVar19 = pAVar23->score, lVar19 < FVar15)) {
              pAVar22 = pAVar41;
              do {
                if (((((pAVar23 != pAVar22 && pAVar22->pos <= sVar6) &&
                      (pAVar9 = pAVar22->link, pAVar9 != (AF_Segment)0x0)) &&
                     (pAVar9->link == pAVar22)) && (sVar25 <= pAVar9->pos)) &&
                   (((sVar6 != pAVar22->pos || (sVar25 != pAVar9->pos)) &&
                    ((lVar16 = pAVar22->score, lVar19 < lVar16 &&
                     (lVar19 * 4 - lVar16 != 0 && lVar16 <= lVar19 * 4)))))) {
                  pAVar28 = pAVar41;
                  if (SBORROW8(pAVar23->len,pAVar22->len * 3) !=
                      pAVar23->len + pAVar22->len * -3 < 0) {
                    pAVar17->link = (AF_Segment)0x0;
                    pAVar23->link = (AF_Segment)0x0;
                    break;
                  }
                  do {
                    pAVar40 = pAVar17;
                    if ((pAVar28->link == pAVar22) || (pAVar40 = pAVar23, pAVar28->link == pAVar9))
                    {
                      pAVar28->link = (AF_Segment)0x0;
                      pAVar28->serif = pAVar40;
                    }
                    pAVar28 = pAVar28 + 1;
                  } while (pAVar28 < pAVar38);
                }
                pAVar22 = pAVar22 + 1;
              } while (pAVar22 < pAVar38);
            }
          }
          pAVar23 = pAVar23 + 1;
        } while (pAVar23 < pAVar38);
        for (; pAVar41 < pAVar38; pAVar41 = pAVar41 + 1) {
          pAVar23 = pAVar41->link;
          if ((pAVar23 != (AF_Segment)0x0) && (pAVar41 != pAVar23->link)) {
            pAVar41->link = (AF_Segment)0x0;
            if ((pAVar23->score < FVar15) || (pAVar41->score < pAVar23->score * 4)) {
              pAVar41->serif = pAVar23->link;
            }
          }
        }
      }
    }
    pAVar10 = hints->metrics;
    pAVar41 = hints->axis[uVar27].segments;
    if (pAVar41 == (AF_Segment_conflict)0x0) {
      local_60 = (AF_Segment_conflict)0x0;
    }
    else {
      local_60 = pAVar41 + axis_00->num_segments;
    }
    memory = hints->memory;
    hints->axis[uVar27].num_edges = 0;
    FVar15 = *(FT_Long *)((long)hints->axis[0].embedded.segments + ((uVar14 | 8) - 0x70));
    lVar19 = *(long *)((long)pAVar10 + uVar27 * 0x3bf0 + 0x1e8);
    lVar33 = (long)(int)FVar15;
    lVar16 = (int)lVar19 * lVar33;
    if (0x10 < (int)((ulong)(lVar16 + (lVar16 >> 0x3f) + 0x8000) >> 0x10)) {
      lVar19 = FT_DivFix(0x10,FVar15);
    }
    iVar12 = 0;
    if (pAVar41 < local_60) {
      iVar12 = 0;
      do {
        uVar14 = (ulong)hints->axis[uVar27].num_edges;
        if (uVar14 == 0) {
          local_70 = (AF_Edge_conflict)0x0;
        }
        else {
          pAVar20 = hints->axis[uVar27].edges;
          uVar32 = 0xffff;
          uVar34 = 0;
          local_70 = (AF_Edge_conflict)0x0;
          do {
            if (pAVar20[uVar34].dir == pAVar41->dir) {
              pAVar24 = pAVar20 + uVar34;
              iVar21 = (int)pAVar41->pos - (int)pAVar24->fpos;
              uVar29 = (ushort)iVar21;
              uVar36 = -uVar29;
              if (0 < iVar21) {
                uVar36 = uVar29;
              }
              uVar37 = (ulong)uVar36;
              if (uVar37 < uVar32 && (long)uVar37 < lVar19) {
                if (pAVar41->link != (AF_Segment)0x0) {
                  lVar16 = 0;
                  pAVar23 = pAVar24->first;
                  do {
                    if (pAVar23->link == (AF_Segment)0x0) {
                      bVar42 = true;
                    }
                    else {
                      sVar25 = pAVar41->link->pos;
                      sVar6 = pAVar23->link->pos;
                      iVar21 = (int)sVar6 - (int)sVar25;
                      if (sVar6 < sVar25) {
                        iVar21 = (int)sVar25 - (int)sVar6;
                      }
                      lVar16 = (long)iVar21;
                      bVar42 = lVar16 < lVar19;
                    }
                  } while ((bVar42) && (pAVar23 = pAVar23->edge_next, pAVar23 != pAVar24->first));
                  if (lVar19 <= lVar16) goto LAB_0026f446;
                }
                uVar32 = uVar37;
                local_70 = pAVar24;
              }
            }
LAB_0026f446:
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar14);
        }
        if (local_70 == (AF_Edge_conflict)0x0) {
          iVar12 = af_axis_hints_new_edge
                             (axis_00,(int)pAVar41->pos,(int)pAVar41->dir,'\0',memory,&local_38);
          bVar42 = iVar12 == 0;
          if (bVar42) {
            *(undefined8 *)&local_38->score = 0;
            local_38->first = (AF_Segment)0x0;
            local_38->link = (AF_Edge)0x0;
            local_38->serif = (AF_Edge)0x0;
            local_38->scale = 0;
            local_38->blue_edge = (AF_Width)0x0;
            local_38->pos = 0;
            local_38->flags = '\0';
            local_38->dir = '\0';
            *(undefined6 *)&local_38->field_0x1a = 0;
            *(undefined8 *)local_38 = 0;
            local_38->opos = 0;
            local_38->first = pAVar41;
            local_38->last = pAVar41;
            local_38->dir = pAVar41->dir;
            sVar25 = pAVar41->pos;
            local_38->fpos = sVar25;
            lVar16 = sVar25 * lVar33;
            lVar16 = lVar16 + (lVar16 >> 0x3f) + 0x8000 >> 0x10;
            local_38->opos = lVar16;
            local_38->pos = lVar16;
            pAVar41->edge_next = pAVar41;
          }
        }
        else {
          pAVar41->edge_next = local_70->first;
          local_70->last->edge_next = pAVar41;
          local_70->last = pAVar41;
          bVar42 = true;
        }
        if (!bVar42) {
          return iVar12;
        }
        pAVar41 = pAVar41 + 1;
      } while (pAVar41 < local_60);
    }
    pAVar20 = hints->axis[uVar27].edges;
    if (pAVar20 == (AF_Edge_conflict)0x0) {
      pAVar24 = (AF_Edge_conflict)0x0;
    }
    else {
      pAVar24 = pAVar20 + hints->axis[uVar27].num_edges;
    }
    pAVar30 = pAVar20;
    if (pAVar20 < pAVar24) {
      do {
        pAVar23 = pAVar30->first;
        pAVar17 = pAVar23;
        if (pAVar23 != (AF_Segment)0x0) {
          do {
            pAVar17->edge = pAVar30;
            ppAVar1 = &pAVar17->edge_next;
            pAVar17 = *ppAVar1;
          } while (*ppAVar1 != pAVar23);
        }
        pAVar30 = pAVar30 + 1;
      } while (pAVar30 < pAVar24);
      for (; pAVar20 < pAVar24; pAVar20 = pAVar20 + 1) {
        pAVar23 = pAVar20->first;
        if (pAVar23 == (AF_Segment)0x0) {
          iVar21 = 0;
          iVar31 = 0;
        }
        else {
          iVar21 = 0;
          iVar31 = 0;
          pAVar17 = pAVar23;
          do {
            pAVar9 = pAVar17->serif;
            if (pAVar9 == (AF_Segment)0x0) {
              bVar42 = false;
            }
            else {
              bVar42 = pAVar9->edge != pAVar20;
            }
            bVar4 = pAVar17->flags;
            if ((pAVar17->link != (AF_Segment)0x0) || (bVar42)) {
              pAVar40 = pAVar17->link;
              ppAVar11 = &pAVar20->link;
              if (bVar42) {
                pAVar40 = pAVar9;
                ppAVar11 = &pAVar20->serif;
              }
              pAVar30 = *ppAVar11;
              if (pAVar30 == (AF_Edge_conflict)0x0) {
LAB_0026f62e:
                pAVar30 = pAVar40->edge;
              }
              else {
                uVar13 = (int)pAVar20->fpos - (int)pAVar30->fpos;
                uVar26 = -uVar13;
                if (0 < (int)uVar13) {
                  uVar26 = uVar13;
                }
                sVar25 = pAVar17->pos;
                sVar6 = pAVar40->pos;
                iVar39 = (int)sVar6 - (int)sVar25;
                if (sVar6 < sVar25) {
                  iVar39 = (int)sVar25 - (int)sVar6;
                }
                if ((long)iVar39 < (long)((ulong)uVar26 & 0xffff)) goto LAB_0026f62e;
              }
              if (bVar42) {
                pAVar20->serif = pAVar30;
                pAVar30->flags = pAVar30->flags | 2;
              }
              else {
                pAVar20->link = pAVar30;
              }
            }
            uVar26 = bVar4 & 1;
            iVar21 = iVar21 + uVar26;
            iVar31 = iVar31 + (uint)(byte)((byte)uVar26 ^ 1);
            pAVar17 = pAVar17->edge_next;
          } while (pAVar17 != pAVar23);
        }
        pAVar20->flags = iVar31 <= iVar21 && 0 < iVar21;
        if ((pAVar20->serif != (AF_Edge)0x0) && (pAVar20->link != (AF_Edge)0x0)) {
          pAVar20->serif = (AF_Edge)0x0;
        }
      }
    }
  }
  return iVar12;
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }